

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_wrapper.h
# Opt level: O2

void __thiscall leveldb::IteratorWrapper::Set(IteratorWrapper *this,Iterator *iter)

{
  if (this->iter_ != (Iterator *)0x0) {
    (*this->iter_->_vptr_Iterator[1])();
  }
  this->iter_ = iter;
  if (iter != (Iterator *)0x0) {
    Update(this);
    return;
  }
  this->valid_ = false;
  return;
}

Assistant:

void Set(Iterator *iter) {
            delete iter_;
            iter_ = iter;
            if (iter_ == NULL) {
                valid_ = false;
            } else {
                Update();
            }
        }